

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

void grow_buffer_unsafe(jpeg *j)

{
  int iVar1;
  uint local_1c;
  int c;
  int b;
  jpeg *j_local;
  
  while( true ) {
    if (j->nomore == 0) {
      local_1c = get8(&j->s);
    }
    else {
      local_1c = 0;
    }
    if ((local_1c == 0xff) && (iVar1 = get8(&j->s), iVar1 != 0)) break;
    j->code_buffer = j->code_buffer << 8 | local_1c;
    j->code_bits = j->code_bits + 8;
    if (0x18 < j->code_bits) {
      return;
    }
  }
  j->marker = (uchar)iVar1;
  j->nomore = 1;
  return;
}

Assistant:

static void grow_buffer_unsafe(jpeg *j)
{
   do {
      int b = j->nomore ? 0 : get8(&j->s);
      if (b == 0xff) {
         int c = get8(&j->s);
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer = (j->code_buffer << 8) | b;
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}